

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::js::api::json::AddTapscriptSignTxInRequest::~AddTapscriptSignTxInRequest
          (AddTapscriptSignTxInRequest *this)

{
  ~AddTapscriptSignTxInRequest(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AddTapscriptSignTxInRequest() {
    // do nothing
  }